

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O3

pointer_type
cppcms::impl::
mfunc_to_event_handler<cppcms::impl::tcp_cache_service::server,cppcms::impl::tcp_cache_service::server*,std::shared_ptr<cppcms::impl::tcp_cache_service::session>,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
          (offset_in_server_to_subr f,server *s,
          shared_ptr<cppcms::impl::tcp_cache_service::session> *p1)

{
  event_handler_binder_p1<void_(cppcms::impl::tcp_cache_service::server::*)(const_std::error_code_&,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>),_cppcms::impl::tcp_cache_service::server_*,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
  *this;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *in_R8;
  server *local_40;
  server *local_38;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *local_30;
  
  local_38 = s;
  local_30 = p1;
  this = (event_handler_binder_p1<void_(cppcms::impl::tcp_cache_service::server::*)(const_std::error_code_&,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>),_cppcms::impl::tcp_cache_service::server_*,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
          *)operator_new(0x38);
  event_handler_binder_p1<void_(cppcms::impl::tcp_cache_service::server::*)(const_std::error_code_&,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>),_cppcms::impl::tcp_cache_service::server_*,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
  ::event_handler_binder_p1(this,(offset_in_server_to_subr *)&local_38,&local_40,in_R8);
  *(event_handler_binder_p1<void_(cppcms::impl::tcp_cache_service::server::*)(const_std::error_code_&,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>),_cppcms::impl::tcp_cache_service::server_*,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
    **)f = this;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_(const_std::error_code_&)> *)f;
}

Assistant:

booster::aio::event_handler::pointer_type mfunc_to_event_handler(void (C::*f)(booster::system::error_code const &,P1),S s,P1in const &p1)
{
	return new event_handler_binder_p1<void (C::*)(booster::system::error_code const &,P1),S,P1in>(f,s,p1);
}